

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O0

int unit_cmp_exact(void)

{
  int i;
  unit *up;
  int local_14;
  
  if (UnitsOn == 0) {
    return 0;
  }
  if (unitonflag != 0) {
    if ((usp[-1].dim[0] == '\t') || (usp->dim[0] == '\t')) {
      return 1;
    }
    for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
      if (usp->dim[(long)local_14 + -0x18] != usp->dim[local_14]) {
        chkfperror();
        return 0;
      }
    }
    if (1e-05 < ABS(usp->factor / usp[-1].factor - 1.0)) {
      chkfperror();
      return 0;
    }
  }
  return 1;
}

Assistant:

int
unit_cmp_exact() { /* returns 1 if top two units on stack are same */
	struct unit *up;
	int i;

	{if (!UnitsOn) return 0;}
	up = usp - 1;
   if (unitonflag) {
	if (up->dim[0] == 9 || usp->dim[0] == 9) {
		return 1;
	}
	for (i=0; i<NDIM; i++) {
		if (up->dim[i] != usp->dim[i]) {
			chkfperror();
			return 0;
		}
	}
	if (OUTTOLERANCE(up->factor, usp->factor)) {
		chkfperror();
		return 0;
	}
   }
	return 1;
}